

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcBlast.c
# Opt level: O3

void Wlc_BlastMultiplier3
               (Gia_Man_t *pNew,int *pArgA,int *pArgB,int nArgA,int nArgB,Vec_Int_t *vRes,
               int fSigned,int fCla)

{
  int iVar1;
  int iVar2;
  void *pvVar3;
  uint uVar4;
  Vec_Wec_t *vProds;
  Vec_Wec_t *vLevels;
  Vec_Int_t *pVVar5;
  long lVar6;
  Vec_Int_t *pVVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  uint uVar14;
  long lVar15;
  uint local_e4;
  uint local_e0;
  Vec_Int_t *local_d8;
  
  uVar11 = (ulong)(uint)nArgA;
  uVar14 = nArgB + nArgA;
  vProds = (Vec_Wec_t *)malloc(0x10);
  uVar8 = (nArgB + nArgA) - 1;
  local_e4 = 8;
  if (6 < uVar8) {
    local_e4 = uVar14;
  }
  vProds->nCap = local_e4;
  if (local_e4 == 0) {
    local_d8 = (Vec_Int_t *)0x0;
  }
  else {
    local_d8 = (Vec_Int_t *)calloc((long)(int)local_e4,0x10);
  }
  vProds->pArray = local_d8;
  vProds->nSize = uVar14;
  vLevels = (Vec_Wec_t *)malloc(0x10);
  vLevels->nCap = local_e4;
  if (local_e4 == 0) {
    pVVar5 = (Vec_Int_t *)0x0;
  }
  else {
    pVVar5 = (Vec_Int_t *)calloc((long)(int)local_e4,0x10);
  }
  vLevels->pArray = pVVar5;
  vLevels->nSize = uVar14;
  local_e0 = uVar14;
  if (0 < nArgA) {
    iVar2 = 1;
    lVar6 = 0;
    uVar12 = 0;
    do {
      if (0 < nArgB) {
        uVar13 = 0;
        lVar15 = lVar6;
        do {
          uVar4 = Gia_ManHashAnd(pNew,pArgA[uVar12],pArgB[uVar13]);
          if ((int)uVar4 < 0) {
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                          ,0x132,"int Abc_LitNotCond(int, int)");
          }
          iVar1 = (int)uVar13;
          iVar9 = (int)uVar12 + iVar1;
          if ((int)local_e0 <= iVar9) {
            uVar10 = local_e0 * 2;
            local_e0 = iVar2 + iVar1;
            if ((int)uVar10 <= (int)local_e0) {
              uVar10 = local_e0;
            }
            if (uVar10 - local_e4 != 0 && (int)local_e4 <= (int)uVar10) {
              if (local_d8 == (Vec_Int_t *)0x0) {
                local_d8 = (Vec_Int_t *)malloc((ulong)uVar10 << 4);
              }
              else {
                local_d8 = (Vec_Int_t *)realloc(local_d8,(ulong)uVar10 << 4);
              }
              vProds->pArray = local_d8;
              memset(local_d8 + (int)local_e4,0,(long)(int)(uVar10 - local_e4) << 4);
              vProds->nCap = uVar10;
              local_e4 = uVar10;
            }
            vProds->nSize = local_e0;
          }
          if ((int)local_e0 <= iVar9) goto LAB_008a018e;
          Vec_IntPush((Vec_Int_t *)((long)&local_d8->nCap + lVar15),
                      uVar4 ^ (fSigned != 0 && (uVar12 == nArgA - 1) != (nArgB - 1 == uVar13)));
          if (vLevels->nSize <= iVar9) {
            uVar4 = vLevels->nSize * 2;
            uVar10 = iVar2 + iVar1;
            if ((int)uVar4 <= (int)uVar10) {
              uVar4 = uVar10;
            }
            iVar1 = vLevels->nCap;
            if (iVar1 < (int)uVar4) {
              if (vLevels->pArray == (Vec_Int_t *)0x0) {
                pVVar5 = (Vec_Int_t *)malloc((ulong)uVar4 << 4);
              }
              else {
                pVVar5 = (Vec_Int_t *)realloc(vLevels->pArray,(ulong)uVar4 << 4);
              }
              vLevels->pArray = pVVar5;
              memset(pVVar5 + iVar1,0,(long)(int)(uVar4 - iVar1) << 4);
              vLevels->nCap = uVar4;
            }
            vLevels->nSize = uVar10;
          }
          pVVar5 = vLevels->pArray;
          Vec_IntPush((Vec_Int_t *)((long)&pVVar5->nCap + lVar15),0);
          uVar13 = uVar13 + 1;
          lVar15 = lVar15 + 0x10;
        } while ((uint)nArgB != uVar13);
      }
      uVar12 = uVar12 + 1;
      iVar2 = iVar2 + 1;
      lVar6 = lVar6 + 0x10;
    } while (uVar12 != uVar11);
  }
  if (fSigned == 0) {
    Wlc_BlastReduceMatrix(pNew,vProds,vLevels,vRes,0,fCla);
  }
  else {
    if ((int)local_e0 <= nArgA) {
      uVar10 = nArgA + 1;
      uVar4 = local_e0 * 2;
      if ((int)(local_e0 * 2) <= (int)uVar10) {
        uVar4 = uVar10;
      }
      if (uVar4 - local_e4 != 0 && (int)local_e4 <= (int)uVar4) {
        if (local_d8 == (Vec_Int_t *)0x0) {
          local_d8 = (Vec_Int_t *)malloc((long)(int)uVar4 << 4);
        }
        else {
          local_d8 = (Vec_Int_t *)realloc(local_d8,(long)(int)uVar4 << 4);
        }
        vProds->pArray = local_d8;
        memset(local_d8 + (int)local_e4,0,(long)(int)(uVar4 - local_e4) << 4);
        vProds->nCap = uVar4;
      }
      vProds->nSize = uVar10;
      local_e0 = uVar10;
    }
    if ((nArgA < 0) || ((int)local_e0 <= nArgA)) {
LAB_008a018e:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWec.h"
                    ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
    }
    Vec_IntPush(local_d8 + uVar11,1);
    if (vLevels->nSize <= nArgA) {
      uVar10 = nArgA + 1;
      uVar4 = vLevels->nSize * 2;
      if ((int)uVar4 <= (int)uVar10) {
        uVar4 = uVar10;
      }
      iVar2 = vLevels->nCap;
      if (iVar2 < (int)uVar4) {
        if (vLevels->pArray == (Vec_Int_t *)0x0) {
          pVVar5 = (Vec_Int_t *)malloc((ulong)uVar4 << 4);
        }
        else {
          pVVar5 = (Vec_Int_t *)realloc(vLevels->pArray,(ulong)uVar4 << 4);
        }
        vLevels->pArray = pVVar5;
        memset(pVVar5 + iVar2,0,(long)(int)(uVar4 - iVar2) << 4);
        vLevels->nCap = uVar4;
      }
      vLevels->nSize = uVar10;
    }
    pVVar5 = vLevels->pArray;
    Vec_IntPush(pVVar5 + uVar11,0);
    uVar4 = vProds->nSize;
    if ((int)uVar4 <= (int)uVar8) {
      uVar10 = uVar4 * 2;
      if ((int)(uVar4 * 2) <= (int)uVar14) {
        uVar10 = uVar14;
      }
      iVar2 = vProds->nCap;
      if (iVar2 < (int)uVar10) {
        if (local_d8 == (Vec_Int_t *)0x0) {
          pVVar7 = (Vec_Int_t *)malloc((long)(int)uVar10 << 4);
        }
        else {
          pVVar7 = (Vec_Int_t *)realloc(local_d8,(long)(int)uVar10 << 4);
        }
        vProds->pArray = pVVar7;
        memset(pVVar7 + iVar2,0,(long)(int)(uVar10 - iVar2) << 4);
        vProds->nCap = uVar10;
      }
      vProds->nSize = uVar14;
      uVar4 = uVar14;
    }
    if (((int)uVar8 < 0) || ((int)uVar4 <= (int)uVar8)) goto LAB_008a018e;
    local_d8 = vProds->pArray;
    Vec_IntPush(local_d8 + uVar8,1);
    uVar4 = vLevels->nSize;
    if ((int)uVar4 <= (int)uVar8) {
      uVar10 = uVar4 * 2;
      if ((int)(uVar4 * 2) <= (int)uVar14) {
        uVar10 = uVar14;
      }
      iVar2 = vLevels->nCap;
      if (iVar2 < (int)uVar10) {
        if (pVVar5 == (Vec_Int_t *)0x0) {
          pVVar5 = (Vec_Int_t *)malloc((ulong)uVar10 << 4);
        }
        else {
          pVVar5 = (Vec_Int_t *)realloc(pVVar5,(ulong)uVar10 << 4);
        }
        vLevels->pArray = pVVar5;
        memset(pVVar5 + iVar2,0,(long)(int)(uVar10 - iVar2) << 4);
        vLevels->nCap = uVar10;
      }
      vLevels->nSize = uVar14;
      uVar4 = uVar14;
    }
    if (uVar4 <= uVar8) goto LAB_008a018e;
    pVVar5 = vLevels->pArray;
    Vec_IntPush(pVVar5 + uVar8,0);
    Wlc_BlastReduceMatrix(pNew,vProds,vLevels,vRes,fSigned,fCla);
    local_e4 = vProds->nCap;
  }
  if ((int)local_e4 < 1) {
    if (local_d8 != (Vec_Int_t *)0x0) goto LAB_008a0121;
  }
  else {
    lVar6 = 0;
    do {
      pvVar3 = *(void **)((long)&local_d8->pArray + lVar6);
      if (pvVar3 != (void *)0x0) {
        free(pvVar3);
        *(undefined8 *)((long)&local_d8->pArray + lVar6) = 0;
      }
      lVar6 = lVar6 + 0x10;
    } while ((ulong)local_e4 << 4 != lVar6);
LAB_008a0121:
    free(local_d8);
    pVVar5 = vLevels->pArray;
  }
  free(vProds);
  iVar2 = vLevels->nCap;
  if ((long)iVar2 < 1) {
    if (pVVar5 == (Vec_Int_t *)0x0) goto LAB_008a0175;
  }
  else {
    lVar6 = 0;
    do {
      pvVar3 = *(void **)((long)&pVVar5->pArray + lVar6);
      if (pvVar3 != (void *)0x0) {
        free(pvVar3);
        *(undefined8 *)((long)&pVVar5->pArray + lVar6) = 0;
      }
      lVar6 = lVar6 + 0x10;
    } while ((long)iVar2 * 0x10 != lVar6);
  }
  free(pVVar5);
LAB_008a0175:
  free(vLevels);
  return;
}

Assistant:

void Wlc_BlastMultiplier3( Gia_Man_t * pNew, int * pArgA, int * pArgB, int nArgA, int nArgB, Vec_Int_t * vRes, int fSigned, int fCla )
{
    Vec_Wec_t * vProds  = Vec_WecStart( nArgA + nArgB );
    Vec_Wec_t * vLevels = Vec_WecStart( nArgA + nArgB );
    int i, k;
    for ( i = 0; i < nArgA; i++ )
        for ( k = 0; k < nArgB; k++ )
        {
            int fCompl = fSigned && ((i == nArgA-1) ^ (k == nArgB-1));
            Vec_WecPush( vProds,  i+k, Abc_LitNotCond(Gia_ManHashAnd(pNew, pArgA[i], pArgB[k]), fCompl) );
            Vec_WecPush( vLevels, i+k, 0 );
        }
    if ( fSigned )
    {
        Vec_WecPush( vProds,  nArgA, 1 );
        Vec_WecPush( vLevels, nArgA, 0 );

        Vec_WecPush( vProds,  nArgA+nArgB-1, 1 );
        Vec_WecPush( vLevels, nArgA+nArgB-1, 0 );
    }

    Wlc_BlastReduceMatrix( pNew, vProds, vLevels, vRes, fSigned, fCla );
//    Wlc_BlastReduceMatrix2( pNew, vProds, vRes, fSigned, fCla );

    Vec_WecFree( vProds );
    Vec_WecFree( vLevels );
}